

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O1

void Cmd_cd_play(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *__nptr;
  char musname [16];
  char local_18 [16];
  
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 == 1) {
    builtin_strncpy(local_18,",CD,",5);
  }
  else {
    __nptr = FCommandLine::operator[](argv,1);
    atoi(__nptr);
    mysnprintf(local_18,0x10,",CD,%d");
  }
  S_ChangeMusic(local_18,0,true,false);
  return;
}

Assistant:

CCMD (cd_play)
{
	char musname[16];

	if (argv.argc() == 1)
	{
		strcpy (musname, ",CD,");
	}
	else
	{
		mysnprintf (musname, countof(musname), ",CD,%d", atoi(argv[1]));
	}
	S_ChangeMusic (musname, 0, true);
}